

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

Color * LoadImagePalette(Image image,int maxPaletteSize,int *colorCount)

{
  Color *pCVar1;
  int iVar2;
  Color *__ptr;
  Color *pCVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  __ptr = LoadImageColors(image);
  if (__ptr == (Color *)0x0) {
    pCVar3 = (Color *)0x0;
    iVar6 = 0;
  }
  else {
    pCVar3 = (Color *)malloc((long)maxPaletteSize * 4);
    uVar4 = 0;
    uVar5 = 0;
    if (0 < maxPaletteSize) {
      uVar5 = (ulong)(uint)maxPaletteSize;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pCVar1 = pCVar3 + uVar4;
      pCVar1->r = '\0';
      pCVar1->g = '\0';
      pCVar1->b = '\0';
      pCVar1->a = '\0';
    }
    iVar6 = 0;
    for (iVar2 = 0; iVar2 < image.height * image.width; iVar2 = iVar2 + 1) {
      if (__ptr[iVar2].a != '\0') {
        for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
          if ((((__ptr[iVar2].r == pCVar3[uVar4].r) && (__ptr[iVar2].g == pCVar3[uVar4].g)) &&
              (__ptr[iVar2].b == pCVar3[uVar4].b)) && (__ptr[iVar2].a == pCVar3[uVar4].a))
          goto LAB_0018119f;
        }
        pCVar3[iVar6] = __ptr[iVar2];
        iVar6 = iVar6 + 1;
        if (maxPaletteSize <= iVar6) {
          TraceLog(4,"IMAGE: Palette is greater than %i colors",maxPaletteSize);
          iVar2 = image.height * image.width;
        }
      }
LAB_0018119f:
    }
    free(__ptr);
  }
  *colorCount = iVar6;
  return pCVar3;
}

Assistant:

Color *LoadImagePalette(Image image, int maxPaletteSize, int *colorCount)
{
    #define COLOR_EQUAL(col1, col2) ((col1.r == col2.r)&&(col1.g == col2.g)&&(col1.b == col2.b)&&(col1.a == col2.a))

    int palCount = 0;
    Color *palette = NULL;
    Color *pixels = LoadImageColors(image);

    if (pixels != NULL)
    {
        palette = (Color *)RL_MALLOC(maxPaletteSize*sizeof(Color));

        for (int i = 0; i < maxPaletteSize; i++) palette[i] = BLANK;   // Set all colors to BLANK

        for (int i = 0; i < image.width*image.height; i++)
        {
            if (pixels[i].a > 0)
            {
                bool colorInPalette = false;

                // Check if the color is already on palette
                for (int j = 0; j < maxPaletteSize; j++)
                {
                    if (COLOR_EQUAL(pixels[i], palette[j]))
                    {
                        colorInPalette = true;
                        break;
                    }
                }

                // Store color if not on the palette
                if (!colorInPalette)
                {
                    palette[palCount] = pixels[i];      // Add pixels[i] to palette
                    palCount++;

                    // We reached the limit of colors supported by palette
                    if (palCount >= maxPaletteSize)
                    {
                        i = image.width*image.height;   // Finish palette get
                        TRACELOG(LOG_WARNING, "IMAGE: Palette is greater than %i colors", maxPaletteSize);
                    }
                }
            }
        }

        UnloadImageColors(pixels);
    }

    *colorCount = palCount;

    return palette;
}